

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTLogicExpression.cpp
# Opt level: O2

void __thiscall MathML::AST::LogicExpression::~LogicExpression(LogicExpression *this)

{
  reference ppIVar1;
  ulong __n;
  
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__LogicExpression_00a05998;
  for (__n = 0; __n < (ulong)((long)(this->mOperands).
                                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->mOperands).
                                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    ppIVar1 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::at
                        (&this->mOperands,__n);
    if (*ppIVar1 != (value_type)0x0) {
      (*(*ppIVar1)->_vptr_INode[1])();
    }
  }
  std::_Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::~_Vector_base
            (&(this->mOperands).
              super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>);
  return;
}

Assistant:

LogicExpression::~LogicExpression()
        {
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                delete mOperands.at( i );
            }
        }